

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *local_48;
  size_t i;
  uchar *p;
  size_t bytes_to_copy;
  size_t stored_bytes;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  sVar1 = X->n;
  puVar2 = (uchar *)(sVar1 * 8);
  local_48 = (uchar *)buflen;
  if (puVar2 < buflen) {
    i = (size_t)(buf + sVar1 * -8 + buflen);
    memset(buf,0,buflen + sVar1 * -8);
    p = puVar2;
  }
  else {
    for (; i = (size_t)buf, p = (uchar *)buflen, local_48 < puVar2; local_48 = local_48 + 1) {
      if ((*(ulong *)((long)X->p + ((ulong)local_48 & 0xfffffffffffffff8)) >>
           (sbyte)(((ulong)local_48 & 7) << 3) & 0xff) != 0) {
        return -8;
      }
    }
  }
  for (local_48 = (uchar *)0x0; local_48 < p; local_48 = local_48 + 1) {
    p[i + (-1 - (long)local_48)] =
         (uchar)(*(ulong *)((long)X->p + ((ulong)local_48 & 0xfffffffffffffff8)) >>
                (sbyte)(((ulong)local_48 & 7) << 3));
  }
  return 0;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X,
                              unsigned char *buf, size_t buflen )
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;
    size_t i;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    stored_bytes = X->n * ciL;

    if( stored_bytes < buflen )
    {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = buf + buflen - stored_bytes;
        memset( buf, 0, buflen - stored_bytes );
    }
    else
    {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = buflen;
        p = buf;
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        p[bytes_to_copy - i - 1] = GET_BYTE( X, i );

    return( 0 );
}